

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O1

char JSONWorker::Hex(char **pos)

{
  byte bVar1;
  char cVar2;
  char *pcVar3;
  byte bVar4;
  char cVar5;
  byte bVar6;
  
  pcVar3 = *pos;
  *pos = pcVar3 + 1;
  cVar2 = *pcVar3;
  cVar5 = cVar2;
  if (9 < (byte)(cVar2 - 0x30U)) {
    cVar5 = cVar2 + '\t';
  }
  if (0x30 < (byte)(cVar2 - 0x30U)) {
    cVar5 = cVar2 + '\t';
  }
  cVar2 = pcVar3[1];
  bVar1 = cVar2 - 0x30;
  bVar4 = cVar2 - 0x37;
  if (bVar1 < 10) {
    bVar4 = bVar1;
  }
  bVar6 = cVar2 + 0xa9;
  if (bVar1 < 0x31) {
    bVar6 = bVar4;
  }
  return cVar5 << 4 | bVar6;
}

Assistant:

json_char JSONWorker::Hex(const json_char * & pos) json_nothrow {
    /*
	takes the numeric value of the next two characters and convert them
	\u0058 becomes 0x58

	In case of \u, it's SpecialChar's responsibility to move past the first two chars
	as this method is also used for \x
	*/
    //First character
    json_uchar hi = *pos++ - 48;
    if (hi > 48){  //A-F don't immediately follow 0-9, so have to pull them down a little
	   hi -= 39;
    } else if (hi > 9){  //neither do a-f
	   hi -= 7;
    }
    //second character
    json_uchar lo = *pos - 48;
    if (lo > 48){  //A-F don't immediately follow 0-9, so have to pull them down a little
	   lo -= 39;
    } else if (lo > 9){  //neither do a-f
	   lo -= 7;
    }
    //combine them
    return (json_char)((hi << 4) | lo);
}